

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.h
# Opt level: O1

void __thiscall
slang::ast::ConditionalExpression::visitExprs<slang::analysis::SampledValueFuncVisitor&>
          (ConditionalExpression *this,SampledValueFuncVisitor *visitor)

{
  size_t sVar1;
  pointer pCVar2;
  Expression *this_00;
  long lVar3;
  
  sVar1 = (this->conditions)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    pCVar2 = (this->conditions)._M_ptr;
    lVar3 = 0;
    do {
      this_00 = *(Expression **)((long)&(pCVar2->expr).ptr + lVar3);
      Expression::
      visitExpression<slang::ast::Expression_const,slang::analysis::SampledValueFuncVisitor&>
                (this_00,this_00,visitor);
      lVar3 = lVar3 + 0x10;
    } while (sVar1 << 4 != lVar3);
  }
  Expression::
  visitExpression<slang::ast::Expression_const,slang::analysis::SampledValueFuncVisitor&>
            (this->left_,this->left_,visitor);
  Expression::
  visitExpression<slang::ast::Expression_const,slang::analysis::SampledValueFuncVisitor&>
            (this->right_,this->right_,visitor);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        for (auto& cond : conditions) {
            cond.expr->visit(visitor);
            if (cond.pattern)
                cond.pattern->visit(visitor);
        }

        left().visit(visitor);
        right().visit(visitor);
    }